

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_compute(float64 **den,uint32 **den_idx,vector_t *obs,gauden_t *g,uint32 mgau,
                  uint32 **prev_den_idx)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  float64 *pfVar4;
  vector_t pfVar5;
  vector_t *ppfVar6;
  vector_t **pppfVar7;
  float32 *pfVar8;
  vector_t *ppfVar9;
  uint32 *puVar10;
  ulong uVar11;
  ulong uVar12;
  float64 fVar13;
  double dVar14;
  
  uVar1 = g->n_density;
  uVar2 = g->n_top;
  if (uVar1 < uVar2) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x479,
                  "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                 );
  }
  if (g->fullvar == (vector_t ****)0x0) {
    if (uVar2 == uVar1) {
      if (g->n_feat != 0) {
        uVar12 = 0;
        do {
          uVar1 = g->n_density;
          if ((ulong)uVar1 != 0) {
            pfVar4 = den[uVar12];
            puVar10 = den_idx[uVar12];
            uVar3 = g->veclen[uVar12];
            pfVar5 = obs[uVar12];
            ppfVar6 = g->mean[mgau][uVar12];
            ppfVar9 = g->var[mgau][uVar12];
            pfVar8 = g->norm[mgau][uVar12];
            uVar11 = 0;
            do {
              fVar13 = log_diag_eval(pfVar5,pfVar8[uVar11],ppfVar6[uVar11],ppfVar9[uVar11],uVar3);
              pfVar4[uVar11] = fVar13;
              puVar10[uVar11] = (uint32)uVar11;
              uVar11 = uVar11 + 1;
            } while (uVar1 != uVar11);
          }
          if (g->n_density != 0) {
            uVar11 = 0;
            do {
              dVar14 = exp((double)den[uVar12][uVar11]);
              den[uVar12][uVar11] = (float64)dVar14;
              uVar11 = uVar11 + 1;
            } while (uVar11 < g->n_density);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < g->n_feat);
      }
    }
    else {
      if (uVar1 <= uVar2) {
        __assert_fail("g->n_top < g->n_density",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x49e,
                      "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                     );
      }
      if (g->n_feat != 0) {
        uVar12 = 0;
        do {
          if (prev_den_idx == (uint32 **)0x0) {
            puVar10 = (uint32 *)0x0;
          }
          else {
            puVar10 = prev_den_idx[uVar12];
          }
          log_topn_densities(den[uVar12],den_idx[uVar12],g->n_top,g->n_density,g->veclen[uVar12],
                             obs[uVar12],g->mean[mgau][uVar12],g->var[mgau][uVar12],
                             g->norm[mgau][uVar12],puVar10);
          if (g->n_top != 0) {
            uVar11 = 0;
            do {
              dVar14 = exp((double)den[uVar12][uVar11]);
              den[uVar12][uVar11] = (float64)dVar14;
              uVar11 = uVar11 + 1;
            } while (uVar11 < g->n_top);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < g->n_feat);
      }
    }
  }
  else {
    if (uVar2 != uVar1) {
      __assert_fail("g->n_top == g->n_density",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x47d,
                    "int gauden_compute(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                   );
    }
    if (g->n_feat != 0) {
      uVar12 = 0;
      do {
        uVar1 = g->n_density;
        if ((ulong)uVar1 != 0) {
          pfVar4 = den[uVar12];
          puVar10 = den_idx[uVar12];
          uVar3 = g->veclen[uVar12];
          pfVar5 = obs[uVar12];
          ppfVar6 = g->mean[mgau][uVar12];
          pppfVar7 = g->fullvar[mgau][uVar12];
          pfVar8 = g->norm[mgau][uVar12];
          uVar11 = 0;
          do {
            fVar13 = log_full_eval(pfVar5,pfVar8[uVar11],ppfVar6[uVar11],pppfVar7[uVar11],uVar3);
            pfVar4[uVar11] = fVar13;
            puVar10[uVar11] = (uint32)uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        if (g->n_density != 0) {
          uVar11 = 0;
          do {
            dVar14 = exp((double)den[uVar12][uVar11]);
            den[uVar12][uVar11] = (float64)dVar14;
            uVar11 = uVar11 + 1;
          } while (uVar11 < g->n_density);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < g->n_feat);
    }
  }
  return 0;
}

Assistant:

int
gauden_compute(float64 **den,		/* density array for a mixture Gaussian */
	       uint32 **den_idx,	/* density index array for n_top < n_density eval */
	       vector_t *obs,		/* observation vector for some time */
	       gauden_t *g,		/* Gaussian density structure */
	       uint32 mgau,		/* id of the mixture Gau. to evaluate */
	       uint32 **prev_den_idx)   /* Previous frame's top N densities (or NULL) */
{
    uint32 j, k;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    /* Top-N computation not (yet) possible for full covariances */
    if (g->fullvar) {
	assert(g->n_top == g->n_density);
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities_full(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->fullvar[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else if (g->n_top == g->n_density) {
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j]);

	    for (k = 0; k < g->n_density; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }
    else {
	assert(g->n_top < g->n_density);

	for (j = 0; j < g->n_feat; j++) {
	    log_topn_densities(den[j],
			       den_idx[j],
			       g->n_top,
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j],
			       prev_den_idx ? prev_den_idx[j] : NULL);

	    for (k = 0; k < g->n_top; k++) {
		den[j][k] = exp( den[j][k] );
	    }
	}
    }


#ifdef GAUDEN_VERBOSE
    gauden_print(stdout,
		 den, den_idx, g,
		 global_map, n_global_map);
#endif

    return S3_SUCCESS;
}